

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O2

void __thiscall pbrt::FilmBase::FilmBase(FilmBase *this,FilmBaseParameters *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  int vb;
  int va;
  
  (this->fullResolution).super_Tuple2<pbrt::Point2,_int> =
       (p->fullResolution).super_Tuple2<pbrt::Point2,_int>;
  TVar6 = (p->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>;
  (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int> =
       (p->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>;
  (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int> = TVar6;
  (this->filter).
  super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  .bits = 0;
  (this->filter).
  super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  .bits = (p->filter).
          super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
          .bits;
  this->diagonal = p->diagonal * 0.001;
  this->sensor = p->sensor;
  std::__cxx11::string::string((string *)&this->filename,(string *)&p->filename);
  uVar1 = (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar2 = (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.x;
  if ((int)uVar1 < iVar2) {
    uVar3 = (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.y;
    iVar4 = (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.y;
    if ((int)uVar3 < iVar4) {
      _vb = (ulong)uVar1 << 0x20;
      if ((int)uVar1 < 0) {
        LogFatal<char_const(&)[19],char_const(&)[2],char_const(&)[19],int&,char_const(&)[2],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.h"
                   ,0xb8,"Check failed: %s >= %s with %s = %s, %s = %s",
                   (char (*) [19])"pixelBounds.pMin.x",(char (*) [2])0x28b5108,
                   (char (*) [19])"pixelBounds.pMin.x",&va,(char (*) [2])0x28b5108,&vb);
      }
      iVar5 = (this->fullResolution).super_Tuple2<pbrt::Point2,_int>.x;
      _vb = CONCAT44(iVar2,iVar5);
      if (iVar5 < iVar2) {
        LogFatal<char_const(&)[19],char_const(&)[17],char_const(&)[19],int&,char_const(&)[17],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.h"
                   ,0xb9,"Check failed: %s <= %s with %s = %s, %s = %s",
                   (char (*) [19])"pixelBounds.pMax.x",(char (*) [17])"fullResolution.x",
                   (char (*) [19])"pixelBounds.pMax.x",&va,(char (*) [17])"fullResolution.x",&vb);
      }
      _vb = (ulong)uVar3 << 0x20;
      if ((int)uVar3 < 0) {
        LogFatal<char_const(&)[19],char_const(&)[2],char_const(&)[19],int&,char_const(&)[2],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.h"
                   ,0xba,"Check failed: %s >= %s with %s = %s, %s = %s",
                   (char (*) [19])"pixelBounds.pMin.y",(char (*) [2])0x28b5108,
                   (char (*) [19])"pixelBounds.pMin.y",&va,(char (*) [2])0x28b5108,&vb);
      }
      iVar2 = (this->fullResolution).super_Tuple2<pbrt::Point2,_int>.y;
      _vb = CONCAT44(iVar4,iVar2);
      if (iVar4 <= iVar2) {
        if (LOGGING_LogLevel < 1) {
          Log<pbrt::Point2<int>&,pbrt::Bounds2<int>&>
                    (Verbose,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.h"
                     ,0xbd,"Created film with full resolution %s, pixelBounds %s",
                     &this->fullResolution,&this->pixelBounds);
        }
        return;
      }
      LogFatal<char_const(&)[19],char_const(&)[17],char_const(&)[19],int&,char_const(&)[17],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.h"
                 ,0xbb,"Check failed: %s <= %s with %s = %s, %s = %s",
                 (char (*) [19])"pixelBounds.pMax.y",(char (*) [17])"fullResolution.y",
                 (char (*) [19])"pixelBounds.pMax.y",&va,(char (*) [17])"fullResolution.y",&vb);
    }
  }
  LogFatal<char_const(&)[23]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/film.h"
             ,0xb7,"Check failed: %s",(char (*) [23])"!pixelBounds.IsEmpty()");
}

Assistant:

FilmBase(FilmBaseParameters p)
        : fullResolution(p.fullResolution),
          pixelBounds(p.pixelBounds),
          filter(p.filter),
          diagonal(p.diagonal * .001f),
          sensor(p.sensor),
          filename(p.filename) {
        CHECK(!pixelBounds.IsEmpty());
        CHECK_GE(pixelBounds.pMin.x, 0);
        CHECK_LE(pixelBounds.pMax.x, fullResolution.x);
        CHECK_GE(pixelBounds.pMin.y, 0);
        CHECK_LE(pixelBounds.pMax.y, fullResolution.y);
        LOG_VERBOSE("Created film with full resolution %s, pixelBounds %s",
                    fullResolution, pixelBounds);
    }